

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_9::DiskHandle::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  size_t __n;
  long lVar1;
  Entry *pEVar2;
  RemoveConst<kj::ReadableDirectory::Entry> *pRVar3;
  Entry *pEVar4;
  Array<kj::ReadableDirectory::Entry> *pAVar5;
  int iVar6;
  int iVar7;
  Type TVar8;
  uint uVar9;
  __off64_t _Var10;
  dirent64 *pdVar11;
  size_t size;
  ulong uVar12;
  String *pSVar13;
  size_t sVar14;
  Array<kj::ReadableDirectory::Entry> *result;
  Vector<kj::ReadableDirectory::Entry> entries;
  Fault f_3;
  Fault f_4;
  stat stats;
  Vector<kj::ReadableDirectory::Entry> local_138;
  DIR *local_110;
  Fault local_108;
  String SStack_100;
  int *local_e0;
  Fault local_d8;
  Array<kj::ReadableDirectory::Entry> *local_d0;
  undefined1 local_c8 [16];
  size_t sStack_b8;
  mode_t local_b0;
  __uid_t _Stack_ac;
  
  do {
    _Var10 = lseek64((this->fd).fd,0,0);
    if (-1 < _Var10) {
      iVar6 = 0;
      break;
    }
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_138.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_138);
  }
  do {
    iVar6 = dup((this->fd).fd);
    if (-1 < iVar6) {
      iVar7 = 0;
      break;
    }
    iVar7 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar7 == -1);
  if (iVar7 != 0) {
    local_138.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_138);
  }
  local_d0 = __return_storage_ptr__;
  local_110 = fdopendir(iVar6);
  if (local_110 == (DIR *)0x0) {
    close(iVar6);
    __errno_location();
    local_138.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_138);
  }
  local_138.builder.ptr = (Entry *)0x0;
  local_138.builder.pos = (Entry *)0x0;
  local_138.builder.endPtr = (Entry *)0x0;
  local_138.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_e0 = __errno_location();
LAB_002074fc:
  *local_e0 = 0;
  pdVar11 = readdir64(local_110);
  pAVar5 = local_d0;
  if (pdVar11 == (dirent64 *)0x0) {
    if (*local_e0 != 0) {
      local_108.exception = (Exception *)0x0;
      local_c8._0_8_ = 0;
      local_c8._8_8_ = 0;
      kj::_::Debug::Fault::init
                (&local_108,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_108);
    }
    if (local_138.builder.pos != local_138.builder.endPtr) {
      Vector<kj::ReadableDirectory::Entry>::setCapacity
                (&local_138,(long)local_138.builder.pos - (long)local_138.builder.ptr >> 5);
    }
    pRVar3 = local_138.builder.pos;
    pEVar2 = local_138.builder.ptr;
    uVar12 = (long)local_138.builder.pos - (long)local_138.builder.ptr >> 5;
    pAVar5->ptr = local_138.builder.ptr;
    pAVar5->size_ = uVar12;
    pAVar5->disposer = local_138.builder.disposer;
    local_138.builder.ptr = (Entry *)0x0;
    local_138.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
    local_138.builder.endPtr = (Entry *)0x0;
    if (pRVar3 != pEVar2) {
      lVar1 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::__introsort_loop<kj::ReadableDirectory::Entry*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pEVar2,pRVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<kj::ReadableDirectory::Entry*,__gnu_cxx::__ops::_Iter_less_iter>
                (pEVar2,pRVar3);
    }
    pEVar4 = local_138.builder.endPtr;
    pRVar3 = local_138.builder.pos;
    pEVar2 = local_138.builder.ptr;
    if (local_138.builder.ptr != (Entry *)0x0) {
      local_138.builder.ptr = (Entry *)0x0;
      local_138.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
      local_138.builder.endPtr = (Entry *)0x0;
      (**(local_138.builder.disposer)->_vptr_ArrayDisposer)
                (local_138.builder.disposer,pEVar2,0x20,(long)pRVar3 - (long)pEVar2 >> 5,
                 (long)pEVar4 - (long)pEVar2 >> 5,
                 ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry>::destruct);
    }
    closedir(local_110);
    return pAVar5;
  }
  __s = pdVar11->d_name;
  size = strlen(__s);
  __n = size + 1;
  if (size == 2) goto LAB_00207558;
  if (size == 1) goto code_r0x0020753c;
  goto LAB_0020756e;
code_r0x0020753c:
  iVar6 = bcmp(__s,".",__n);
  if (iVar6 != 0) {
    if (__n == 3) {
LAB_00207558:
      iVar6 = bcmp(__s,"..",__n);
      if (iVar6 == 0) goto LAB_002074fc;
    }
LAB_0020756e:
    if ((size < 8) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
      if (pdVar11->d_type == '\0') {
        do {
          iVar6 = fstatat64((this->fd).fd,__s,(stat64 *)local_c8,0x100);
          if (-1 < iVar6) {
            iVar6 = 0;
            break;
          }
          uVar9 = kj::_::Debug::getOsErrorNumber(false);
          pdVar11 = (dirent64 *)((ulong)pdVar11 & 0xffffffff);
          if (uVar9 != 0xffffffff) {
            pdVar11 = (dirent64 *)(ulong)uVar9;
          }
          iVar6 = (int)pdVar11;
        } while (uVar9 == 0xffffffff);
        if (iVar6 != 0) {
          local_d8.exception = (Exception *)0x0;
          local_108.exception = (Exception *)0x0;
          SStack_100.content.ptr = (char *)0x0;
          kj::_::Debug::Fault::init
                    (&local_d8,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_d8);
        }
        TVar8 = modeToType(local_b0);
        local_108.exception._0_4_ = TVar8;
        heapString(&SStack_100,__s,size);
        if (local_138.builder.pos == local_138.builder.endPtr) {
          sVar14 = (long)local_138.builder.endPtr - (long)local_138.builder.ptr >> 4;
          if (local_138.builder.endPtr == local_138.builder.ptr) {
            sVar14 = 4;
          }
          Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_138,sVar14);
        }
        (local_138.builder.pos)->type = (Type)local_108.exception;
        ((local_138.builder.pos)->name).content.ptr = SStack_100.content.ptr;
        ((local_138.builder.pos)->name).content.size_ = SStack_100.content.size_;
        ((local_138.builder.pos)->name).content.disposer = SStack_100.content.disposer;
        pSVar13 = &SStack_100;
      }
      else {
        TVar8 = modeToType((uint)pdVar11->d_type << 0xc);
        local_c8._0_4_ = TVar8;
        heapString((String *)(local_c8 + 8),__s,size);
        if (local_138.builder.pos == local_138.builder.endPtr) {
          sVar14 = (long)local_138.builder.endPtr - (long)local_138.builder.ptr >> 4;
          if (local_138.builder.endPtr == local_138.builder.ptr) {
            sVar14 = 4;
          }
          Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_138,sVar14);
        }
        (local_138.builder.pos)->type = local_c8._0_4_;
        ((local_138.builder.pos)->name).content.ptr = (char *)local_c8._8_8_;
        ((local_138.builder.pos)->name).content.size_ = sStack_b8;
        ((local_138.builder.pos)->name).content.disposer =
             (ArrayDisposer *)CONCAT44(_Stack_ac,local_b0);
        pSVar13 = (String *)(local_c8 + 8);
      }
      (pSVar13->content).ptr = (char *)0x0;
      (pSVar13->content).size_ = 0;
      local_138.builder.pos = local_138.builder.pos + 1;
    }
  }
  goto LAB_002074fc;
}

Assistant:

Array<ReadableDirectory::Entry> listEntries() const {
    return list(true, [](StringPtr name, FsNode::Type type) {
      return ReadableDirectory::Entry { type, heapString(name), };
    });
  }